

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

CPAccessResult
aa64_cacheop_pou_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  ulong uVar1;
  uint uVar2;
  ARMMMUIdx AVar3;
  uint64_t uVar4;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 != 0) {
      uVar2 = env->pstate >> 2 & 3;
      goto LAB_0061ab35;
    }
    uVar2 = env->uncached_cpsr & 0x1f;
    if (uVar2 != 0x10) {
      if (uVar2 == 0x16) {
        return CP_ACCESS_OK;
      }
      if (uVar2 == 0x1a) {
        return CP_ACCESS_OK;
      }
      if ((uVar1 >> 0x21 & 1) != 0) {
        if (uVar2 == 0x16) {
          if (((uint)uVar1 >> 0x1c & 1) == 0) {
            return CP_ACCESS_OK;
          }
        }
        else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) {
          return CP_ACCESS_OK;
        }
      }
      goto LAB_0061ab8d;
    }
  }
  else {
    if ((env->v7m).exception != 0) goto LAB_0061ab8d;
    uVar2 = ~(env->v7m).control[(env->v7m).secure] & 1;
LAB_0061ab35:
    if (uVar2 == 1) goto LAB_0061ab8d;
    if (uVar2 != 0) {
      return CP_ACCESS_OK;
    }
  }
  AVar3 = arm_mmu_idx_el_aarch64(env,0);
  if ((*(byte *)((long)(env->cp15).cptr_el + (ulong)(AVar3 == ARMMMUIdx_E20_0) * 8 + -0x1d) & 4) ==
      0) {
    return CP_ACCESS_TRAP;
  }
LAB_0061ab8d:
  uVar4 = arm_hcr_el2_eff_aarch64(env);
  if (((uint)uVar4 >> 0x18 & 1) == 0) {
    return CP_ACCESS_OK;
  }
  return CP_ACCESS_TRAP_EL2;
}

Assistant:

static CPAccessResult aa64_cacheop_pou_access(CPUARMState *env,
                                              const ARMCPRegInfo *ri,
                                              bool isread)
{
    /* Cache invalidate/clean to Point of Unification... */
    switch (arm_current_el(env)) {
    case 0:
        /* ... EL0 must UNDEF unless SCTLR_EL1.UCI is set.  */
        if (!(arm_sctlr(env, 0) & SCTLR_UCI)) {
            return CP_ACCESS_TRAP;
        }
        /* fall through */
    case 1:
        /* ... EL1 must trap to EL2 if HCR_EL2.TPU is set.  */
        if (arm_hcr_el2_eff(env) & HCR_TPU) {
            return CP_ACCESS_TRAP_EL2;
        }
        break;
    }
    return CP_ACCESS_OK;
}